

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

string * __thiscall
llvm::StringRef::upper_abi_cxx11_(string *__return_storage_ptr__,StringRef *this)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  
  sVar2 = this->Length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar2);
  sVar2 = this->Length;
  if (sVar2 != 0) {
    sVar3 = 0;
    do {
      cVar1 = this->Data[sVar3];
      cVar4 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar4 = cVar1;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p[sVar3] = cVar4;
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringRef::upper() const {
  std::string Result(size(), char());
  for (size_type i = 0, e = size(); i != e; ++i) {
    Result[i] = toUpper(Data[i]);
  }
  return Result;
}